

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool generateLowResWaveform<short>
               (TWaveformViewT<short> *waveform,TWaveformT<short> *waveformLowRes,int nWindow)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  size_type *psVar5;
  reference pvVar6;
  int iVar7;
  int in_EDX;
  vector<short,_std::allocator<short>_> *in_RSI;
  long *in_RDI;
  int64_t itest;
  int64_t i_1;
  int64_t i;
  TWaveformT<short> waveformAbs;
  int64_t n;
  short *samples;
  deque<long,_std::allocator<long>_> que;
  int k;
  value_type_conflict4 *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff06;
  int in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  short in_stack_ffffffffffffff16;
  size_type in_stack_ffffffffffffff18;
  size_type __n;
  deque<long,_std::allocator<long>_> *in_stack_ffffffffffffff20;
  vector<short,_std::allocator<short>_> *this;
  value_type_conflict4 *local_c0;
  size_type local_b8;
  deque<long,_std::allocator<long>_> *in_stack_ffffffffffffff50;
  vector<short,_std::allocator<short>_> local_a8;
  size_type local_90;
  long local_88;
  int local_18;
  int local_14;
  vector<short,_std::allocator<short>_> *local_10;
  long *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  local_18 = local_14;
  std::allocator<long>::allocator((allocator<long> *)0x177104);
  std::deque<long,_std::allocator<long>_>::deque
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (allocator_type *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT15(in_stack_ffffffffffffff15,
                               CONCAT14(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))));
  std::allocator<long>::~allocator((allocator<long> *)0x17712a);
  local_88 = *local_8;
  __n = local_8[1];
  this = (vector<short,_std::allocator<short>_> *)&stack0xffffffffffffff57;
  local_90 = __n;
  std::allocator<short>::allocator((allocator<short> *)0x177167);
  std::vector<short,_std::allocator<short>_>::vector
            (this,__n,(allocator_type *)
                      CONCAT26(in_stack_ffffffffffffff16,
                               CONCAT15(in_stack_ffffffffffffff15,
                                        CONCAT14(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ))));
  std::allocator<short>::~allocator((allocator<short> *)0x177187);
  for (local_b8 = 0; (long)local_b8 < (long)local_90; local_b8 = local_b8 + 1) {
    in_stack_ffffffffffffff16 = *(short *)(local_88 + local_b8 * 2);
    if (in_stack_ffffffffffffff16 < 1) {
      in_stack_ffffffffffffff16 = -in_stack_ffffffffffffff16;
    }
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[](&local_a8,local_b8);
    *pvVar4 = in_stack_ffffffffffffff16;
  }
  for (local_c0 = (value_type_conflict4 *)0x0; (long)local_c0 < (long)local_90;
      local_c0 = (value_type_conflict4 *)((long)local_c0 + 1)) {
    if ((long)local_c0 < (long)local_18) {
      while( true ) {
        bVar2 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x17726b);
        in_stack_ffffffffffffff15 = false;
        if (!bVar2) {
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                             (&local_a8,(size_type)local_c0);
          in_stack_ffffffffffffff10 = (int)*pvVar4;
          psVar5 = (size_type *)
                   std::deque<long,_std::allocator<long>_>::back
                             ((deque<long,_std::allocator<long>_> *)
                              CONCAT26(in_stack_ffffffffffffff16,
                                       CONCAT15(in_stack_ffffffffffffff15,
                                                CONCAT14(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10))));
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[](&local_a8,*psVar5);
          in_stack_ffffffffffffff15 = *pvVar4 <= in_stack_ffffffffffffff10;
        }
        if ((bool)in_stack_ffffffffffffff15 == false) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)
                   CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)
                 CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
    }
    else {
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x17731f);
        bVar2 = false;
        if (!bVar3) {
          pvVar6 = std::deque<long,_std::allocator<long>_>::front
                             ((deque<long,_std::allocator<long>_> *)
                              CONCAT26(in_stack_ffffffffffffff16,
                                       CONCAT15(in_stack_ffffffffffffff15,
                                                CONCAT14(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10))));
          bVar2 = *pvVar6 <= (long)local_c0 - (long)local_18;
        }
        if (!bVar2) break;
        std::deque<long,_std::allocator<long>_>::pop_front
                  ((deque<long,_std::allocator<long>_> *)
                   CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
      }
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x17737e);
        bVar2 = false;
        if (!bVar3) {
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                             (&local_a8,(size_type)local_c0);
          sVar1 = *pvVar4;
          psVar5 = (size_type *)
                   std::deque<long,_std::allocator<long>_>::back
                             ((deque<long,_std::allocator<long>_> *)
                              CONCAT26(in_stack_ffffffffffffff16,
                                       CONCAT15(in_stack_ffffffffffffff15,
                                                CONCAT14(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10))));
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[](&local_a8,*psVar5);
          bVar2 = *pvVar4 <= sVar1;
        }
        if (!bVar2) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)
                   CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)
                 CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      iVar7 = local_18 / 2;
      in_stack_fffffffffffffef8 = local_c0;
      psVar5 = (size_type *)
               std::deque<long,_std::allocator<long>_>::front
                         ((deque<long,_std::allocator<long>_> *)
                          CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT15(in_stack_ffffffffffffff15,
                                            CONCAT14(in_stack_ffffffffffffff14,
                                                     in_stack_ffffffffffffff10))));
      pvVar4 = std::vector<short,_std::allocator<short>_>::operator[](&local_a8,*psVar5);
      in_stack_ffffffffffffff06 = *pvVar4;
      pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                         (local_10,(long)local_c0 - (long)iVar7);
      *pvVar4 = in_stack_ffffffffffffff06;
    }
  }
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT15(in_stack_ffffffffffffff15,
                               CONCAT14(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))));
  std::deque<long,_std::allocator<long>_>::~deque(in_stack_ffffffffffffff50);
  return true;
}

Assistant:

bool generateLowResWaveform(const TWaveformViewT<T> & waveform, TWaveformT<T> & waveformLowRes, int nWindow) {
    waveformLowRes.resize(waveform.n);

    int k = nWindow;
    std::deque<int64_t> que(k);

    //auto [samples, n] = waveform;
    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            waveformLowRes[itest] = waveformAbs[que.front()];
        }
    }

    return true;
}